

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

void __thiscall QEventDispatcherGlib::~QEventDispatcherGlib(QEventDispatcherGlib *this)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  GPollFDWithQSocketNotifier *pGVar4;
  Data *pDVar5;
  pointer ppGVar6;
  QList<GPollFDWithQSocketNotifier_*> *this_00;
  ulong uVar7;
  
  *(undefined ***)this = &PTR_metaObject_006a2e48;
  lVar1 = *(long *)(this + 8);
  QTimerInfoList::clearTimers((QTimerInfoList *)(*(long *)(lVar1 + 0xb0) + 0x60));
  lVar2 = *(long *)(lVar1 + 0xb0);
  piVar3 = *(int **)(lVar2 + 0x70);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate(*(QArrayData **)(lVar2 + 0x70),8,0x10);
    }
  }
  g_source_destroy(*(undefined8 *)(lVar1 + 0xb0));
  g_source_unref(*(undefined8 *)(lVar1 + 0xb0));
  *(undefined8 *)(lVar1 + 0xb0) = 0;
  g_source_destroy(*(undefined8 *)(lVar1 + 0xb8));
  g_source_unref(*(undefined8 *)(lVar1 + 0xb8));
  *(undefined8 *)(lVar1 + 0xb8) = 0;
  this_00 = (QList<GPollFDWithQSocketNotifier_*> *)(*(long *)(lVar1 + 0xa8) + 0x60);
  if (*(long *)(*(long *)(lVar1 + 0xa8) + 0x70) != 0) {
    uVar7 = 0;
    do {
      ppGVar6 = QList<GPollFDWithQSocketNotifier_*>::data(this_00);
      pGVar4 = ppGVar6[uVar7];
      g_source_remove_poll(*(undefined8 *)(lVar1 + 0xa8),pGVar4);
      operator_delete(pGVar4,0x10);
      uVar7 = uVar7 + 1;
      this_00 = (QList<GPollFDWithQSocketNotifier_*> *)(*(long *)(lVar1 + 0xa8) + 0x60);
    } while (uVar7 < *(ulong *)(*(long *)(lVar1 + 0xa8) + 0x70));
  }
  pDVar5 = (this_00->d).d;
  if (pDVar5 != (Data *)0x0) {
    LOCK();
    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this_00->d).d)->super_QArrayData,8,0x10);
    }
  }
  g_source_destroy(*(undefined8 *)(lVar1 + 0xa8));
  g_source_unref(*(undefined8 *)(lVar1 + 0xa8));
  *(undefined8 *)(lVar1 + 0xa8) = 0;
  g_source_destroy(*(undefined8 *)(lVar1 + 0xa0));
  g_source_unref(*(undefined8 *)(lVar1 + 0xa0));
  *(undefined8 *)(lVar1 + 0xa0) = 0;
  g_main_context_pop_thread_default(*(undefined8 *)(lVar1 + 0x98));
  g_main_context_unref(*(undefined8 *)(lVar1 + 0x98));
  *(undefined8 *)(lVar1 + 0x98) = 0;
  QAbstractEventDispatcherV2::~QAbstractEventDispatcherV2((QAbstractEventDispatcherV2 *)this);
  return;
}

Assistant:

QEventDispatcherGlib::~QEventDispatcherGlib()
{
    Q_D(QEventDispatcherGlib);

    // destroy all timer sources
    d->timerSource->timerList.clearTimers();
    d->timerSource->timerList.~QTimerInfoList();
    g_source_destroy(&d->timerSource->source);
    g_source_unref(&d->timerSource->source);
    d->timerSource = nullptr;
    g_source_destroy(&d->idleTimerSource->source);
    g_source_unref(&d->idleTimerSource->source);
    d->idleTimerSource = nullptr;

    // destroy socket notifier source
    for (int i = 0; i < d->socketNotifierSource->pollfds.size(); ++i) {
        GPollFDWithQSocketNotifier *p = d->socketNotifierSource->pollfds[i];
        g_source_remove_poll(&d->socketNotifierSource->source, &p->pollfd);
        delete p;
    }
    d->socketNotifierSource->pollfds.~QList<GPollFDWithQSocketNotifier *>();
    g_source_destroy(&d->socketNotifierSource->source);
    g_source_unref(&d->socketNotifierSource->source);
    d->socketNotifierSource = nullptr;

    // destroy post event source
    g_source_destroy(&d->postEventSource->source);
    g_source_unref(&d->postEventSource->source);
    d->postEventSource = nullptr;

    Q_ASSERT(d->mainContext != nullptr);
#if GLIB_CHECK_VERSION (2, 22, 0)
    g_main_context_pop_thread_default (d->mainContext);
#endif
    g_main_context_unref(d->mainContext);
    d->mainContext = nullptr;
}